

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int LEnum(TValue *l,TValue *r)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  lua_Number lVar8;
  double dVar9;
  long local_18;
  
  uVar2 = l->tt_;
  if (((uVar2 & 0xf) != 3) || (uVar3 = r->tt_, (uVar3 & 0xf) != 3)) {
    __assert_fail("(((((((l))->tt_)) & 0x0F)) == (3)) && (((((((r))->tt_)) & 0x0F)) == (3))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x29c,"int LEnum(const TValue *, const TValue *)");
  }
  if (uVar2 == 3) {
    dVar1 = (l->value_).n;
    if (uVar3 == 0x13) {
      lVar4 = (r->value_).i;
      if (0x40000000000000 < lVar4 + 0x20000000000000U) {
        iVar5 = luaV_flttointeger(dVar1,&local_18,F2Iceil);
        bVar6 = local_18 <= lVar4;
        if (iVar5 == 0) {
          bVar6 = dVar1 < 0.0;
        }
        goto LAB_0013b39a;
      }
      lVar8 = (lua_Number)lVar4;
    }
    else {
      if (uVar3 != 3) {
        __assert_fail("((((r))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x2a9,"int LEnum(const TValue *, const TValue *)");
      }
      lVar8 = (r->value_).n;
    }
    bVar6 = lVar8 < dVar1;
  }
  else {
    if (uVar2 != 0x13) {
      __assert_fail("((((l))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2a5,"int LEnum(const TValue *, const TValue *)");
    }
    lVar4 = (l->value_).i;
    if (uVar3 != 3) {
      if (uVar3 != 0x13) {
        __assert_fail("((((r))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x2a2,"int LEnum(const TValue *, const TValue *)");
      }
      bVar6 = lVar4 <= (r->value_).i;
      goto LAB_0013b39a;
    }
    dVar1 = (r->value_).n;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1;
    if (0x40000000000000 < lVar4 + 0x20000000000000U) {
      auVar7 = vroundsd_avx(auVar7,auVar7,9);
      dVar9 = auVar7._0_8_;
      bVar6 = lVar4 <= (long)dVar9;
      if (9.223372036854776e+18 <= dVar9) {
        bVar6 = 0.0 < dVar1;
      }
      if (dVar9 < -9.223372036854776e+18) {
        bVar6 = 0.0 < dVar1;
      }
      goto LAB_0013b39a;
    }
    bVar6 = dVar1 < (double)lVar4;
  }
  bVar6 = !bVar6;
LAB_0013b39a:
  return (int)bVar6;
}

Assistant:

static int LEnum (const TValue *l, const TValue *r) {
  lua_assert(ttisnumber(l) && ttisnumber(r));
  if (ttisinteger(l)) {
    lua_Integer li = ivalue(l);
    if (ttisinteger(r))
      return li <= ivalue(r);  /* both are integers */
    else  /* 'l' is int and 'r' is float */
      return LEintfloat(li, fltvalue(r));  /* l <= r ? */
  }
  else {
    lua_Number lf = fltvalue(l);  /* 'l' must be float */
    if (ttisfloat(r))
      return luai_numle(lf, fltvalue(r));  /* both are float */
    else  /* 'l' is float and 'r' is int */
      return LEfloatint(lf, ivalue(r));
  }
}